

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_pps.c
# Opt level: O3

MPP_RET process_pps(H264_SLICE_t *currSlice)

{
  bitread_ctx_t *bitctx;
  h264_pps_t *pps;
  uint uVar1;
  h264d_cur_ctx_t *sps;
  MPP_RET MVar2;
  RK_U32 RVar3;
  h264_pps_t *phVar4;
  char *fmt;
  undefined8 uVar5;
  RK_U32 _out;
  RK_U32 local_34;
  
  sps = currSlice->p_Cur;
  bitctx = &sps->bitctx;
  pps = &sps->pps;
  memset(pps,0,0x8b8);
  MVar2 = mpp_read_ue(bitctx,&local_34);
  (sps->bitctx).ret = MVar2;
  if (MVar2 == MPP_OK) {
    (sps->pps).pic_parameter_set_id = local_34;
    MVar2 = mpp_read_ue(bitctx,&local_34);
    (sps->bitctx).ret = MVar2;
    if (MVar2 == MPP_OK) {
      (sps->pps).seq_parameter_set_id = local_34;
      if (0x1f < local_34) {
        (sps->pps).seq_parameter_set_id = 0;
      }
      if (0xff < (sps->pps).pic_parameter_set_id) {
        (sps->pps).pic_parameter_set_id = 0;
      }
      MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
      (sps->bitctx).ret = MVar2;
      if (MVar2 == MPP_OK) {
        (sps->pps).entropy_coding_mode_flag = local_34;
        MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
        (sps->bitctx).ret = MVar2;
        if (MVar2 == MPP_OK) {
          (sps->pps).bottom_field_pic_order_in_frame_present_flag = local_34;
          MVar2 = mpp_read_ue(bitctx,&local_34);
          (sps->bitctx).ret = MVar2;
          if (MVar2 == MPP_OK) {
            (sps->pps).num_slice_groups_minus1 = local_34;
            if (1 < (int)local_34) {
              MVar2 = MPP_ERR_VALUE;
              if (((byte)h264d_debug & 4) == 0) goto LAB_001916fb;
              fmt = "value error(%d).\n";
              uVar5 = 0x52;
              MVar2 = MPP_ERR_VALUE;
LAB_001916f4:
              _mpp_log_l(4,"h264d_pps",fmt,(char *)0x0,uVar5);
              goto LAB_001916fb;
            }
            MVar2 = mpp_read_ue(bitctx,&local_34);
            (sps->bitctx).ret = MVar2;
            if (MVar2 == MPP_OK) {
              (sps->pps).num_ref_idx_l0_default_active_minus1 = local_34;
              if (0x1f < (int)local_34) {
                MVar2 = MPP_ERR_VALUE;
                if (((byte)h264d_debug & 4) == 0) goto LAB_001916fb;
                fmt = "value error(%d).\n";
                uVar5 = 0x54;
                MVar2 = MPP_ERR_VALUE;
                goto LAB_001916f4;
              }
              MVar2 = mpp_read_ue(bitctx,&local_34);
              (sps->bitctx).ret = MVar2;
              if (MVar2 == MPP_OK) {
                (sps->pps).num_ref_idx_l1_default_active_minus1 = local_34;
                if (0x1f < (int)local_34) {
                  MVar2 = MPP_ERR_VALUE;
                  if (((byte)h264d_debug & 4) == 0) goto LAB_001916fb;
                  fmt = "value error(%d).\n";
                  uVar5 = 0x56;
                  MVar2 = MPP_ERR_VALUE;
                  goto LAB_001916f4;
                }
                MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                (sps->bitctx).ret = MVar2;
                if (MVar2 == MPP_OK) {
                  (sps->pps).weighted_pred_flag = local_34;
                  MVar2 = mpp_read_bits(bitctx,2,(RK_S32 *)&local_34);
                  (sps->bitctx).ret = MVar2;
                  if (MVar2 == MPP_OK) {
                    (sps->pps).weighted_bipred_idc = local_34;
                    if (2 < (int)local_34) {
                      MVar2 = MPP_ERR_VALUE;
                      if (((byte)h264d_debug & 4) == 0) goto LAB_001916fb;
                      fmt = "value error(%d).\n";
                      uVar5 = 0x59;
                      MVar2 = MPP_ERR_VALUE;
                      goto LAB_001916f4;
                    }
                    MVar2 = mpp_read_se(bitctx,(RK_S32 *)&local_34);
                    (sps->bitctx).ret = MVar2;
                    if (MVar2 == MPP_OK) {
                      (sps->pps).pic_init_qp_minus26 = local_34;
                      MVar2 = mpp_read_se(bitctx,(RK_S32 *)&local_34);
                      (sps->bitctx).ret = MVar2;
                      if (MVar2 == MPP_OK) {
                        (sps->pps).pic_init_qs_minus26 = local_34;
                        MVar2 = mpp_read_se(bitctx,(RK_S32 *)&local_34);
                        (sps->bitctx).ret = MVar2;
                        if (MVar2 == MPP_OK) {
                          (sps->pps).chroma_qp_index_offset = local_34;
                          (sps->pps).second_chroma_qp_index_offset = local_34;
                          MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                          (sps->bitctx).ret = MVar2;
                          if (MVar2 == MPP_OK) {
                            (sps->pps).deblocking_filter_control_present_flag = local_34;
                            MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                            (sps->bitctx).ret = MVar2;
                            if (MVar2 == MPP_OK) {
                              (sps->pps).constrained_intra_pred_flag = local_34;
                              MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                              (sps->bitctx).ret = MVar2;
                              if (MVar2 == MPP_OK) {
                                (sps->pps).redundant_pic_cnt_present_flag = local_34;
                                if (local_34 != 0) {
                                  MVar2 = MPP_ERR_VALUE;
                                  if (((byte)h264d_debug & 4) == 0) goto LAB_001916fb;
                                  fmt = "value error(%d).\n";
                                  uVar5 = 0x61;
                                  MVar2 = MPP_ERR_VALUE;
                                  goto LAB_001916f4;
                                }
                                RVar3 = mpp_has_more_rbsp_data(bitctx);
                                if (RVar3 == 0) {
                                  (sps->pps).transform_8x8_mode_flag = 0;
                                  local_34 = (sps->pps).chroma_qp_index_offset;
LAB_001918a6:
                                  (sps->pps).second_chroma_qp_index_offset = local_34;
                                  pps->Valid = 1;
                                  goto LAB_00191417;
                                }
                                MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                                (sps->bitctx).ret = MVar2;
                                if (MVar2 == MPP_OK) {
                                  (sps->pps).transform_8x8_mode_flag = local_34;
                                  MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                                  (sps->bitctx).ret = MVar2;
                                  if (MVar2 == MPP_OK) {
                                    (sps->pps).pic_scaling_matrix_present_flag = local_34;
                                    if (local_34 != 0) {
                                      if (((byte)h264d_debug & 4) != 0) {
                                        _mpp_log_l(4,"h264d_pps","Picture scaling matrix present.",
                                                   (char *)0x0);
                                      }
                                      MVar2 = parse_pps_calingLists(bitctx,&sps->sps,pps);
                                      if (MVar2 < MPP_OK) {
                                        if (((byte)h264d_debug & 4) == 0) goto LAB_001916fb;
                                        fmt = "Function error(%d).\n";
                                        uVar5 = 0x68;
                                        goto LAB_001916f4;
                                      }
                                    }
                                    MVar2 = mpp_read_se(bitctx,(RK_S32 *)&local_34);
                                    (sps->bitctx).ret = MVar2;
                                    if (MVar2 == MPP_OK) goto LAB_001918a6;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (MPP_NOK < MVar2) {
LAB_00191417:
    if (((((byte)h264d_debug & 2) != 0) && (pps->Valid != 1)) &&
       (_mpp_log_l(2,"h264d_pps","Assertion %s failed at %s:%d\n",(char *)0x0,"cur_pps->Valid == 1",
                   "process_pps",0x8e), (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    phVar4 = currSlice->p_Vid->ppsSet[(sps->pps).pic_parameter_set_id];
    if (phVar4 == (h264_pps_t *)0x0) {
      phVar4 = (h264_pps_t *)mpp_osal_calloc("process_pps",0x8b8);
      uVar1 = (sps->pps).pic_parameter_set_id;
      currSlice->p_Vid->ppsSet[uVar1] = phVar4;
      phVar4 = currSlice->p_Vid->ppsSet[uVar1];
    }
    memcpy(phVar4,pps,0x8b8);
    sps->p_Vid->spspps_update = 1;
    return MPP_OK;
  }
LAB_001916fb:
  if (((byte)h264d_debug & 4) == 0) {
    return MVar2;
  }
  _mpp_log_l(4,"h264d_pps","Function error(%d).\n",(char *)0x0,0x8c);
  return MVar2;
}

Assistant:

MPP_RET process_pps(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurCtx_t *p_Cur = currSlice->p_Cur;
    BitReadCtx_t *p_bitctx = &p_Cur->bitctx;
    H264_PPS_t *cur_pps = &p_Cur->pps;

    reset_curpps_data(cur_pps);// reset

    FUN_CHECK(ret = parser_pps(p_bitctx, &p_Cur->sps, cur_pps));
    //!< MakePPSavailable
    ASSERT(cur_pps->Valid == 1);
    if (!currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id]) {
        currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id] = mpp_calloc(H264_PPS_t, 1);
    }

    memcpy(currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id], cur_pps, sizeof(H264_PPS_t));
    p_Cur->p_Vid->spspps_update = 1;

    return ret = MPP_OK;
__FAILED:
    return ret;
}